

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O2

void igPushStyleColor(ImGuiCol idx,ImVec4 col)

{
  ImVec4 local_10;
  
  local_10 = col;
  ImGui::PushStyleColor(idx,&local_10);
  return;
}

Assistant:

CIMGUI_API void _igPushStyleColor (ImGuiCol *larg1, ImVec4 const *larg2) {
  ImGuiCol arg1 ;
  ImVec4 arg2 ;
  
  arg1 = *larg1;
  arg2 = *larg2;
  try {
    igPushStyleColor(arg1,arg2);
    
  } catch (...) {
    
  }
}